

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_CustomModel_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_00795c08 == '\x01') {
    DAT_00795c08 = '\0';
    (*(code *)*_CustomModel_CustomModelParamValue_default_instance_)();
  }
  if (DAT_00795cc0 == '\x01') {
    DAT_00795cc0 = 0;
    (*(code *)*_CustomModel_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _CustomModel_CustomModelParamValue_default_instance_.Shutdown();
  _CustomModel_default_instance_.Shutdown();
}